

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

ssize_t uv__recvmsg(int fd,msghdr *msg,int flags)

{
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  void *local_50;
  int *end;
  int *pfd;
  ssize_t rc;
  cmsghdr *cmsg;
  int flags_local;
  msghdr *msg_local;
  int *piStack_10;
  int fd_local;
  
  if (uv__recvmsg::no_msg_cmsg_cloexec == 0) {
    sVar2 = recvmsg(fd,(msghdr *)msg,flags | 0x40000000);
    if (sVar2 != -1) {
      return sVar2;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0x16) {
      piVar3 = __errno_location();
      return (long)-*piVar3;
    }
    pfd = (int *)recvmsg(fd,(msghdr *)msg,flags);
    if (pfd == (int *)0xffffffffffffffff) {
      piVar3 = __errno_location();
      return (long)-*piVar3;
    }
    uv__recvmsg::no_msg_cmsg_cloexec = 1;
  }
  else {
    pfd = (int *)recvmsg(fd,(msghdr *)msg,flags);
  }
  if (pfd == (int *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    piStack_10 = (int *)(long)-*piVar3;
  }
  else if (msg->msg_controllen == 0) {
    piStack_10 = pfd;
  }
  else {
    if (msg->msg_controllen < 0x10) {
      local_50 = (void *)0x0;
    }
    else {
      local_50 = msg->msg_control;
    }
    for (rc = (ssize_t)local_50; rc != 0; rc = (ssize_t)__cmsg_nxthdr((msghdr *)msg,(cmsghdr *)rc))
    {
      if (*(int *)(rc + 0xc) == 1) {
        lVar1 = *(long *)rc;
        for (end = (int *)(rc + 0x10); end < (int *)(rc + lVar1); end = end + 1) {
          uv__cloexec_ioctl(*end,1);
        }
      }
    }
    piStack_10 = pfd;
  }
  return (ssize_t)piStack_10;
}

Assistant:

ssize_t uv__recvmsg(int fd, struct msghdr* msg, int flags) {
  struct cmsghdr* cmsg;
  ssize_t rc;
  int* pfd;
  int* end;
#if defined(__linux__)
  static int no_msg_cmsg_cloexec;
  if (no_msg_cmsg_cloexec == 0) {
    rc = recvmsg(fd, msg, flags | 0x40000000);  /* MSG_CMSG_CLOEXEC */
    if (rc != -1)
      return rc;
    if (errno != EINVAL)
      return UV__ERR(errno);
    rc = recvmsg(fd, msg, flags);
    if (rc == -1)
      return UV__ERR(errno);
    no_msg_cmsg_cloexec = 1;
  } else {
    rc = recvmsg(fd, msg, flags);
  }
#else
  rc = recvmsg(fd, msg, flags);
#endif
  if (rc == -1)
    return UV__ERR(errno);
  if (msg->msg_controllen == 0)
    return rc;
  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg))
    if (cmsg->cmsg_type == SCM_RIGHTS)
      for (pfd = (int*) CMSG_DATA(cmsg),
           end = (int*) ((char*) cmsg + cmsg->cmsg_len);
           pfd < end;
           pfd += 1)
        uv__cloexec(*pfd, 1);
  return rc;
}